

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmeta.cpp
# Opt level: O2

void __thiscall CVmMetaTable::~CVmMetaTable(CVmMetaTable *this)

{
  clear(this);
  free(this->table_);
  free(this->reverse_map_);
  return;
}

Assistant:

CVmMetaTable::~CVmMetaTable()
{
    /* clear the table */
    clear();
    
    /* free the table, if we ever allocated one */
    if (table_ != 0)
        t3free(table_);

    /* free the reverse map */
    t3free(reverse_map_);
}